

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_converter.hpp
# Opt level: O1

type * __thiscall
jsoncons::
value_converter<std::basic_string_view<char,_std::char_traits<char>_>,_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_void>
::convert<char>(type *__return_storage_ptr__,
               value_converter<std::basic_string_view<char,_std::char_traits<char>_>,_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_void>
               *this,basic_string_view<char,_std::char_traits<char>_> *value,semantic_tag tag,
               error_code *ec)

{
  undefined1 *reverse_alphabet;
  int iVar1;
  undefined7 in_register_00000009;
  code *f;
  type tVar2;
  
  (__return_storage_ptr__->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = (int)CONCAT71(in_register_00000009,tag);
  if (iVar1 == 0xc) {
    f = is_base64url<char>;
    reverse_alphabet =
         decode_base64url<char_const*,jsoncons::basic_byte_string<std::allocator<unsigned_char>>>(char_const*,char_const*,jsoncons::basic_byte_string<std::allocator<unsigned_char>>&)
         ::reverse_alphabet;
  }
  else {
    if (iVar1 != 9) {
      if ((iVar1 == 8) &&
         (tVar2 = decode_base16<char_const*,jsoncons::basic_byte_string<std::allocator<unsigned_char>>>
                            (value->_M_str,value->_M_str + value->_M_len,__return_storage_ptr__),
         tVar2.ec == success)) {
        return __return_storage_ptr__;
      }
      std::error_code::operator=(ec,not_byte_string);
      return __return_storage_ptr__;
    }
    f = is_base64<char>;
    reverse_alphabet =
         decode_base64<char_const*,jsoncons::basic_byte_string<std::allocator<unsigned_char>>>(char_const*,char_const*,jsoncons::basic_byte_string<std::allocator<unsigned_char>>&)
         ::reverse_alphabet;
  }
  detail::
  decode_base64_generic<char_const*,bool(*)(char),jsoncons::basic_byte_string<std::allocator<unsigned_char>>>
            (value->_M_str,value->_M_str + value->_M_len,reverse_alphabet,f,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

typename std::enable_if<ext_traits::is_narrow_character<CharT>::value,Into>::type
        convert(const From& value, semantic_tag tag, std::error_code& ec)
        {
            Into bytes(this->get_allocator());
            switch (tag)
            {
                case semantic_tag::base16:
                {
                    auto res = decode_base16(value.begin(), value.end(), bytes);
                    if (res.ec != conv_errc::success)
                    {
                        ec = conv_errc::not_byte_string;
                    }
                    break;
                }
                case semantic_tag::base64:
                {
                    decode_base64(value.begin(), value.end(), bytes);
                    break;
                }
                case semantic_tag::base64url:
                {
                    decode_base64url(value.begin(), value.end(), bytes);
                    break;
                }
                default:
                {
                    ec = conv_errc::not_byte_string;
                    break;
                }
            }
            return bytes;
        }